

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_global_set(wasm_global_t *global,wasm_val_t *val)

{
  wasm_valkind_t wVar1;
  Global *this;
  TypedValue TStack_38;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_global_set");
  wVar1 = val->kind;
  this = wasm_ref_t::As<wabt::interp::Global>((wasm_ref_t *)global);
  if (-1 < (char)wVar1) {
    ToWabtValue(&TStack_38,val);
    wabt::interp::Global::UnsafeSet(this,TStack_38.value);
    return;
  }
  wabt::interp::Global::Set
            (this,(global->super_wasm_extern_t).super_wasm_ref_t.I.store_,
             (Ref)(((((val->of).ref)->I).obj_)->self_).index);
  return;
}

Assistant:

void wasm_global_set(wasm_global_t* global, const wasm_val_t* val) {
  TRACE0();
  if (wasm_valkind_is_ref(val->kind)) {
    global->As<Global>()->Set(*global->I.store(), val->of.ref->I->self());
  } else {
    global->As<Global>()->UnsafeSet(ToWabtValue(*val).value);
  }
}